

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O0

void __thiscall soul::Annotation::set(Annotation *this,string *name,ValueView *value)

{
  bool bVar1;
  int32_t value_00;
  int64_t value_01;
  float value_02;
  double value_03;
  allocator<char> local_121;
  string_view local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  ValueView *local_20;
  ValueView *value_local;
  string *name_local;
  Annotation *this_local;
  
  local_20 = value;
  value_local = (ValueView *)name;
  name_local = (string *)this;
  bVar1 = choc::value::ValueView::isInt32(value);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)value_local);
    value_00 = choc::value::ValueView::getInt32(local_20);
    set(this,&local_40,value_00);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar1 = choc::value::ValueView::isInt64(local_20);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_70,(string *)value_local);
      value_01 = choc::value::ValueView::getInt64(local_20);
      set(this,&local_70,value_01);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      bVar1 = choc::value::ValueView::isFloat32(local_20);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_90,(string *)value_local);
        value_02 = choc::value::ValueView::getFloat32(local_20);
        set(this,&local_90,value_02);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        bVar1 = choc::value::ValueView::isFloat64(local_20);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_b0,(string *)value_local);
          value_03 = choc::value::ValueView::getFloat64(local_20);
          set(this,&local_b0,value_03);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          bVar1 = choc::value::ValueView::isBool(local_20);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_d0,(string *)value_local);
            bVar1 = choc::value::ValueView::getBool(local_20);
            set(this,&local_d0,bVar1);
            std::__cxx11::string::~string((string *)&local_d0);
          }
          else {
            bVar1 = choc::value::ValueView::isString(local_20);
            if (!bVar1) {
              throwInternalCompilerError("set",0xdb);
            }
            std::__cxx11::string::string((string *)&local_f0,(string *)value_local);
            local_120 = choc::value::ValueView::getString(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&local_110,&local_120,&local_121);
            set(this,&local_f0,&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            std::allocator<char>::~allocator(&local_121);
            std::__cxx11::string::~string((string *)&local_f0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Annotation::set (const std::string& name, const choc::value::ValueView& value)
{
    if (value.isInt32())    return set (std::string (name), value.getInt32());
    if (value.isInt64())    return set (std::string (name), value.getInt64());
    if (value.isFloat32())  return set (std::string (name), value.getFloat32());
    if (value.isFloat64())  return set (std::string (name), value.getFloat64());
    if (value.isBool())     return set (std::string (name), value.getBool());
    if (value.isString())   return set (std::string (name), std::string (value.getString()));

    SOUL_ASSERT_FALSE; // other types not currently handled..
}